

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssnode_dfs.c
# Opt level: O0

int_t ssnode_dfs(int jcol,int kcol,int_t *asub,int_t *xa_begin,int_t *xa_end,int_t *xprune,
                int *marker,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int_t *piVar5;
  int iVar6;
  int_t iVar7;
  int next;
  int_t *xlsub;
  int_t *lsub;
  int *supno;
  int *xsup;
  int_t mem_error;
  int kmark;
  int krow;
  int nsuper;
  int_t nzlmax;
  int_t new_next;
  int_t nextl;
  int_t ito;
  int_t ifrom;
  int_t k;
  int_t i;
  int_t *xprune_local;
  int_t *xa_end_local;
  int_t *xa_begin_local;
  int_t *asub_local;
  int local_10;
  int kcol_local;
  int jcol_local;
  
  piVar3 = Glu->xsup;
  piVar4 = Glu->supno;
  xlsub = Glu->lsub;
  piVar5 = Glu->xlsub;
  krow = Glu->nzlmax;
  iVar1 = piVar4[jcol];
  iVar6 = iVar1 + 1;
  piVar4[jcol] = iVar6;
  nzlmax = piVar5[jcol];
  _k = xprune;
  xprune_local = xa_end;
  xa_end_local = xa_begin;
  xa_begin_local = asub;
  asub_local._4_4_ = kcol;
  local_10 = jcol;
  for (ifrom = jcol; ifrom <= asub_local._4_4_; ifrom = ifrom + 1) {
    for (ito = xa_end_local[ifrom]; ito < xprune_local[ifrom]; ito = ito + 1) {
      iVar2 = xa_begin_local[ito];
      if (marker[iVar2] != asub_local._4_4_) {
        marker[iVar2] = asub_local._4_4_;
        next = nzlmax + 1;
        xlsub[nzlmax] = iVar2;
        nzlmax = next;
        if (krow <= next) {
          iVar7 = sLUMemXpand(local_10,next,LSUB,&krow,Glu);
          if (iVar7 != 0) {
            return iVar7;
          }
          xlsub = Glu->lsub;
        }
      }
    }
    piVar4[ifrom] = iVar6;
  }
  if (local_10 < asub_local._4_4_) {
    nsuper = nzlmax * 2 - piVar5[local_10];
    while (krow < nsuper) {
      iVar7 = sLUMemXpand(local_10,nzlmax,LSUB,&krow,Glu);
      if (iVar7 != 0) {
        return iVar7;
      }
      xlsub = Glu->lsub;
    }
    new_next = nzlmax;
    nextl = piVar5[local_10];
    while (ifrom = local_10, nextl < nzlmax) {
      xlsub[new_next] = xlsub[nextl];
      new_next = new_next + 1;
      nextl = nextl + 1;
    }
    while (ifrom = ifrom + 1, ifrom <= asub_local._4_4_) {
      piVar5[ifrom] = nzlmax;
    }
    nzlmax = new_next;
  }
  piVar3[iVar1 + 2] = asub_local._4_4_ + 1;
  piVar4[asub_local._4_4_ + 1] = iVar6;
  _k[asub_local._4_4_] = nzlmax;
  piVar5[asub_local._4_4_ + 1] = nzlmax;
  return 0;
}

Assistant:

int_t
ssnode_dfs (
	   const int   jcol,	    /* in - start of the supernode */
	   const int   kcol, 	    /* in - end of the supernode */
	   const int_t *asub,        /* in */
	   const int_t *xa_begin,    /* in */
	   const int_t *xa_end,      /* in */
	   int_t      *xprune,      /* out */
	   int        *marker,      /* modified */
	   GlobalLU_t *Glu          /* modified */
	   )
{

    int_t i, k, ifrom, ito, nextl, new_next, nzlmax;
    int   nsuper, krow, kmark;
    int_t mem_error;
    int   *xsup, *supno;
    int_t *lsub, *xlsub;
    
    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    nsuper = ++supno[jcol];	/* Next available supernode number */
    nextl = xlsub[jcol];

    for (i = jcol; i <= kcol; i++) {
	/* For each nonzero in A[*,i] */
	for (k = xa_begin[i]; k < xa_end[i]; k++) {	
	    krow = asub[k];
	    kmark = marker[krow];
	    if ( kmark != kcol ) { /* First time visit krow */
		marker[krow] = kcol;
		lsub[nextl++] = krow;
		if ( nextl >= nzlmax ) {
		    mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
		    if ( mem_error ) return (mem_error);
		    lsub = Glu->lsub;
		}
	    }
    	}
	supno[i] = nsuper;
    }

    /* Supernode > 1, then make a copy of the subscripts for pruning */
    if ( jcol < kcol ) {
	new_next = nextl + (nextl - xlsub[jcol]);
	while ( new_next > nzlmax ) {
	    mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax, Glu);
	    if ( mem_error ) return (mem_error);
	    lsub = Glu->lsub;
	}
	ito = nextl;
	for (ifrom = xlsub[jcol]; ifrom < nextl; )
	    lsub[ito++] = lsub[ifrom++];	
        for (i = jcol+1; i <= kcol; i++) xlsub[i] = nextl;
	nextl = ito;
    }

    xsup[nsuper+1] = kcol + 1;
    supno[kcol+1]  = nsuper;
    xprune[kcol]   = nextl;
    xlsub[kcol+1]  = nextl;

    return 0;
}